

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DemandDisk.cpp
# Opt level: O0

ssize_t __thiscall DemandDisk::read(DemandDisk *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Track *this_00;
  Track *this_01;
  mapped_type *this_02;
  ssize_t sVar5;
  size_t __nbytes_00;
  undefined4 in_register_00000034;
  int local_228;
  byte local_1f1;
  lock_guard<std::mutex> lock;
  int revs;
  Track *rescan_track;
  TrackData rescan_trackdata;
  int local_108;
  int rescans;
  int retries;
  Track *track;
  TrackData trackdata;
  undefined1 local_30 [31];
  bool uncached_local;
  CylHead *cylhead_local;
  DemandDisk *this_local;
  
  register0x00000030 = (CylHead *)CONCAT44(in_register_00000034,__fd);
  local_30[0x17] = (byte)__buf & 1;
  __nbytes_00 = CONCAT71((int7)(__nbytes >> 8),(byte)__buf) & 0xffffffffffffff01;
  trackdata._183_1_ = 0;
  local_1f1 = 1;
  cylhead_local = (CylHead *)this;
  if (((ulong)__buf & 1) == 0) {
    CylHead::operator_cast_to_int(register0x00000030);
    std::bitset<256UL>::operator[]((bitset<256UL> *)local_30,(size_t)&this->m_loaded);
    trackdata._183_1_ = 1;
    bVar1 = std::bitset::reference::operator_cast_to_bool((reference *)local_30);
    local_1f1 = bVar1 ^ 0xff;
  }
  if ((trackdata._183_1_ & 1) != 0) {
    std::bitset<256UL>::reference::~reference((reference *)local_30);
  }
  if ((local_1f1 & 1) != 0) {
    __nbytes_00 = 1;
    (*(this->super_Disk)._vptr_Disk[7])((TrackData *)&track,this,stack0xffffffffffffffe8);
    this_00 = TrackData::track((TrackData *)&track);
    uVar2 = (*(this->super_Disk)._vptr_Disk[6])();
    if ((uVar2 & 1) == 0) {
      local_228 = opt.retries;
    }
    else {
      local_228 = 0;
    }
    local_108 = local_228;
    rescan_trackdata._180_4_ = opt.rescans;
    while ((0 < (int)rescan_trackdata._180_4_ || 0 < local_108 &&
           ((0 < (int)rescan_trackdata._180_4_ || (bVar1 = Track::has_good_data(this_00), !bVar1))))
          ) {
      (*(this->super_Disk)._vptr_Disk[7])(&rescan_track,this,stack0xffffffffffffffe8,0);
      this_01 = TrackData::track((TrackData *)&rescan_track);
      iVar3 = Track::size(this_01);
      iVar4 = Track::size(this_00);
      if (iVar4 < iVar3) {
        std::swap<TrackData>((TrackData *)&track,(TrackData *)&rescan_track);
      }
      bVar1 = TrackData::has_flux((TrackData *)&track);
      lock._M_device._4_4_ = 1;
      if (bVar1) {
        lock._M_device._4_4_ = 5;
      }
      rescan_trackdata._180_4_ = rescan_trackdata._180_4_ - lock._M_device._4_4_;
      __nbytes_00 = (size_t)lock._M_device._4_4_;
      local_108 = local_108 - lock._M_device._4_4_;
      TrackData::~TrackData((TrackData *)&rescan_track);
    }
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)&stack0xfffffffffffffe20,
               &(this->super_Disk).m_trackdata_mutex);
    this_02 = std::
              map<CylHead,_TrackData,_std::less<CylHead>,_std::allocator<std::pair<const_CylHead,_TrackData>_>_>
              ::operator[](&(this->super_Disk).m_trackdata,stack0xffffffffffffffe8);
    TrackData::operator=(this_02,(TrackData *)&track);
    CylHead::operator_cast_to_int(stack0xffffffffffffffe8);
    std::bitset<256UL>::operator[]
              ((bitset<256UL> *)&stack0xfffffffffffffe10,(size_t)&this->m_loaded);
    std::bitset<256UL>::reference::operator=((reference *)&stack0xfffffffffffffe10,true);
    std::bitset<256UL>::reference::~reference((reference *)&stack0xfffffffffffffe10);
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&stack0xfffffffffffffe20);
    TrackData::~TrackData((TrackData *)&track);
  }
  sVar5 = Disk::read(&this->super_Disk,(int)stack0xffffffffffffffe8,(void *)0x0,__nbytes_00);
  return sVar5;
}

Assistant:

const TrackData& DemandDisk::read(const CylHead& cylhead, bool uncached)
{
    if (uncached || !m_loaded[cylhead])
    {
        // Quick first read, plus sector-based conversion
        auto trackdata = load(cylhead, true);
        auto& track = trackdata.track();

        // If the disk supports sector-level retries we won't duplicate them.
        auto retries = supports_retries() ? 0 : opt.retries;
        auto rescans = opt.rescans;

        // Consider rescans and error retries.
        while (rescans > 0 || retries > 0)
        {
            // If no more rescans are required, stop when there's nothing to fix.
            if (rescans <= 0 && track.has_good_data())
                break;

            auto rescan_trackdata = load(cylhead);
            auto& rescan_track = rescan_trackdata.track();

            // If the rescan found more sectors, use the new track data.
            if (rescan_track.size() > track.size())
                std::swap(trackdata, rescan_trackdata);

            // Flux reads include 5 revolutions, others just 1
            auto revs = trackdata.has_flux() ? REMAIN_READ_REVS : 1;
            rescans -= revs;
            retries -= revs;
        }

        std::lock_guard<std::mutex> lock(m_trackdata_mutex);
        m_trackdata[cylhead] = std::move(trackdata);
        m_loaded[cylhead] = true;
    }

    return Disk::read(cylhead);
}